

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

bool Host_CheckForConnects(void *userdata)

{
  in_port_t iVar1;
  in_addr iVar2;
  int iVar3;
  uint uVar4;
  sockaddr_in *psVar5;
  sockaddr_in *psVar6;
  BYTE *s_addr_bytes;
  int node;
  sockaddr_in *from;
  int numplayers;
  PreGamePacket packet;
  void *userdata_local;
  
  from._0_4_ = (int)userdata;
  packet.machines[7] = (anon_struct_8_4_8d968fe9)userdata;
  while (psVar5 = PreGet((void *)((long)&from + 4),0x44,false), psVar5 != (sockaddr_in *)0x0) {
    if (from._4_1_ == '0') {
      if (from._5_1_ == '\0') {
        iVar3 = FindNode(psVar5);
        if (doomcom.numnodes == (int)from) {
          if (iVar3 == -1) {
            (*StartScreen->_vptr_FStartupScreen[7])
                      (StartScreen,"Got extra connect from %d.%d.%d.%d:%d",
                       (ulong)(byte)(psVar5->sin_addr).s_addr,
                       (ulong)*(byte *)((long)&(psVar5->sin_addr).s_addr + 1),
                       (ulong)*(byte *)((long)&(psVar5->sin_addr).s_addr + 2),
                       (ulong)*(byte *)((long)&(psVar5->sin_addr).s_addr + 3),(uint)psVar5->sin_port
                      );
            from._5_1_ = '\x05';
            PreSend((void *)((long)&from + 4),2,psVar5);
          }
        }
        else {
          if (iVar3 == -1) {
            uVar4 = (uint)doomcom.numnodes;
            psVar6 = sendaddress + (int)uVar4;
            iVar1 = psVar5->sin_port;
            iVar2.s_addr = (psVar5->sin_addr).s_addr;
            doomcom.numnodes = doomcom.numnodes + 1;
            psVar6->sin_family = psVar5->sin_family;
            psVar6->sin_port = iVar1;
            psVar6->sin_addr = (in_addr)iVar2.s_addr;
            *(undefined8 *)sendaddress[(int)uVar4].sin_zero = *(undefined8 *)psVar5->sin_zero;
            (*StartScreen->_vptr_FStartupScreen[7])
                      (StartScreen,"Got connect from node %d.",(ulong)uVar4);
          }
          SendConAck((int)doomcom.numnodes,(int)from);
        }
      }
      else if (((from._5_1_ != '\x01') && (from._5_1_ == '\x02')) &&
              (s_addr_bytes._4_4_ = FindNode(psVar5), -1 < (int)s_addr_bytes._4_4_)) {
        (*StartScreen->_vptr_FStartupScreen[7])
                  (StartScreen,"Got disconnect from node %d.",(ulong)s_addr_bytes._4_4_);
        doomcom.numnodes = doomcom.numnodes + -1;
        for (; (int)s_addr_bytes._4_4_ < (int)doomcom.numnodes;
            s_addr_bytes._4_4_ = s_addr_bytes._4_4_ + 1) {
          psVar6 = sendaddress + (int)(s_addr_bytes._4_4_ + 1);
          psVar5 = sendaddress + (int)s_addr_bytes._4_4_;
          iVar1 = psVar6->sin_port;
          iVar2.s_addr = (psVar6->sin_addr).s_addr;
          psVar5->sin_family = psVar6->sin_family;
          psVar5->sin_port = iVar1;
          psVar5->sin_addr = (in_addr)iVar2.s_addr;
          *(undefined8 *)sendaddress[(int)s_addr_bytes._4_4_].sin_zero =
               *(undefined8 *)sendaddress[(int)(s_addr_bytes._4_4_ + 1)].sin_zero;
        }
        SendConAck((int)doomcom.numnodes,(int)from);
      }
    }
  }
  if (doomcom.numnodes < (int)from) {
    SendConAck((int)doomcom.numnodes,(int)from);
    userdata_local._7_1_ = false;
  }
  else {
    do {
      psVar5 = PreGet((void *)((long)&from + 4),0x44,false);
      if (psVar5 == (sockaddr_in *)0x0) goto LAB_005e33b4;
    } while ((from._4_1_ != '0') || (from._5_1_ != '\x02'));
    s_addr_bytes._4_4_ = FindNode(psVar5);
    if (-1 < (int)s_addr_bytes._4_4_) {
      doomcom.numnodes = doomcom.numnodes + -1;
      for (; (int)s_addr_bytes._4_4_ < (int)doomcom.numnodes;
          s_addr_bytes._4_4_ = s_addr_bytes._4_4_ + 1) {
        psVar6 = sendaddress + (int)(s_addr_bytes._4_4_ + 1);
        psVar5 = sendaddress + (int)s_addr_bytes._4_4_;
        iVar1 = psVar6->sin_port;
        iVar2.s_addr = (psVar6->sin_addr).s_addr;
        psVar5->sin_family = psVar6->sin_family;
        psVar5->sin_port = iVar1;
        psVar5->sin_addr = (in_addr)iVar2.s_addr;
        *(undefined8 *)sendaddress[(int)s_addr_bytes._4_4_].sin_zero =
             *(undefined8 *)sendaddress[(int)(s_addr_bytes._4_4_ + 1)].sin_zero;
      }
      SendConAck((int)doomcom.numnodes,(int)from);
    }
LAB_005e33b4:
    userdata_local._7_1_ = (int)from <= doomcom.numnodes;
  }
  return userdata_local._7_1_;
}

Assistant:

bool Host_CheckForConnects (void *userdata)
{
	PreGamePacket packet;
	int numplayers = (int)(intptr_t)userdata;
	sockaddr_in *from;
	int node;

	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake != PRE_FAKE)
		{
			continue;
		}
		switch (packet.Message)
		{
		case PRE_CONNECT:
			node = FindNode (from);
			if (doomcom.numnodes == numplayers)
			{
				if (node == -1)
				{
					const BYTE *s_addr_bytes = (const BYTE *)&from->sin_addr;
					StartScreen->NetMessage ("Got extra connect from %d.%d.%d.%d:%d",
						s_addr_bytes[0], s_addr_bytes[1], s_addr_bytes[2], s_addr_bytes[3],
						from->sin_port);
					packet.Message = PRE_ALLFULL;
					PreSend (&packet, 2, from);
				}
			}
			else
			{
				if (node == -1)
				{
					node = doomcom.numnodes++;
					sendaddress[node] = *from;
					StartScreen->NetMessage ("Got connect from node %d.", node);
				}

				// Let the new guest (and everyone else) know we got their message.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;

		case PRE_DISCONNECT:
			node = FindNode (from);
			if (node >= 0)
			{
				StartScreen->NetMessage ("Got disconnect from node %d.", node);
				doomcom.numnodes--;
				while (node < doomcom.numnodes)
				{
					sendaddress[node] = sendaddress[node+1];
					node++;
				}

				// Let remaining guests know that somebody left.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;

		case PRE_KEEPALIVE:
			break;
		}
	}
	if (doomcom.numnodes < numplayers)
	{
		// Send message to everyone as a keepalive
		SendConAck(doomcom.numnodes, numplayers);
		return false;
	}

	// It's possible somebody bailed out after all players were found.
	// Unfortunately, this isn't guaranteed to catch all of them.
	// Oh well. Better than nothing.
	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake == PRE_FAKE && packet.Message == PRE_DISCONNECT)
		{
			node = FindNode (from);
			if (node >= 0)
			{
				doomcom.numnodes--;
				while (node < doomcom.numnodes)
				{
					sendaddress[node] = sendaddress[node+1];
					node++;
				}
				// Let remaining guests know that somebody left.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;
		}
	}
	return doomcom.numnodes >= numplayers;
}